

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbp.h
# Opt level: O0

void __thiscall merlin::lbp::accept_incoming(lbp *this,size_t n)

{
  bool bVar1;
  Type TVar2;
  factor *pfVar3;
  factor *this_00;
  pointer peVar4;
  reference pvVar5;
  reference this_01;
  value B;
  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
  local_30;
  __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
  local_28;
  const_iterator i;
  my_set<merlin::edge_id> *nbrs;
  size_t n_local;
  lbp *this_local;
  
  i._M_current = (edge_id *)
                 graph::neighbors(&(this->super_factor_graph).super_graphical_model.super_graph,n);
  pfVar3 = graphical_model::get_factor(&(this->super_factor_graph).super_graphical_model,n);
  this_00 = bel(this,n);
  factor::operator=(this_00,pfVar3);
  local_28._M_current = (edge_id *)my_set<merlin::edge_id>::begin(i._M_current);
  while( true ) {
    local_30._M_current = (edge_id *)my_set<merlin::edge_id>::end(i._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    peVar4 = __gnu_cxx::
             __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
             ::operator->(&local_28);
    pvVar5 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                       (&this->m_msg_new,peVar4->ridx);
    peVar4 = __gnu_cxx::
             __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
             ::operator->(&local_28);
    this_01 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                        (&this->m_msg,peVar4->ridx);
    factor::operator=(this_01,pvVar5);
    peVar4 = __gnu_cxx::
             __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
             ::operator->(&local_28);
    pvVar5 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                       (&this->m_msg,peVar4->ridx);
    pfVar3 = bel(this,n);
    factor::operator*=(pfVar3,pvVar5);
    TVar2 = Schedule::operator_cast_to_Type(&this->m_sched);
    if (TVar2 == Priority) {
      peVar4 = __gnu_cxx::
               __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
               ::operator->(&local_28);
      indexed_heap::erase(&this->m_priority,peVar4->ridx);
    }
    __gnu_cxx::
    __normal_iterator<const_merlin::edge_id_*,_std::vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>_>
    ::operator++(&local_28);
  }
  pfVar3 = bel(this,n);
  B = factor::sum(pfVar3);
  pfVar3 = bel(this,n);
  factor::operator/=(pfVar3,B);
  return;
}

Assistant:

void accept_incoming(size_t n) {
		const my_set<edge_id>& nbrs = neighbors(n); // get the list of neighbors
		bel(n) = get_factor(n); //   and start with just the local factor
		for (my_set<edge_id>::const_iterator i = nbrs.begin();
				i != nbrs.end(); ++i) {
			m_msg[i->ridx] = m_msg_new[i->ridx]; // accept each new incoming message
			bel(n) *= m_msg[i->ridx];           //   and include it in the belief
			if (m_sched == Schedule::Priority) {
				m_priority.erase(i->ridx); // accepted => remove from priority_ queue
			}
		}
		bel(n) /= bel(n).sum(); // normalize belief
	}